

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O0

VectorMax3d * __thiscall
SimpleBVH::BVH::point_callback(VectorMax3d *__return_storage_ptr__,BVH *this,int f)

{
  bool bVar1;
  Index IVar2;
  CoeffReturnType piVar3;
  ConstRowXpr local_58;
  int local_1c;
  BVH *pBStack_18;
  int f_local;
  BVH *this_local;
  
  local_1c = f;
  pBStack_18 = this;
  this_local = (BVH *)__return_storage_ptr__;
  bVar1 = std::function::operator_cast_to_bool((function *)&this->getPoint);
  if (bVar1) {
    std::function<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_(int)>::operator()
              (__return_storage_ptr__,&this->getPoint,local_1c);
  }
  else {
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&(this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>)
    ;
    if (IVar2 != 2) {
      IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                        (&(this->faces).
                          super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>);
      if (IVar2 != 3) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                      ,0x238,"VectorMax3d SimpleBVH::BVH::point_callback(int) const");
      }
    }
    piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)&this->faces,
                        (long)local_1c,0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_58,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->vertices,
               (long)*piVar3);
    Eigen::Matrix<double,-1,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
              ((Matrix<double,_1,1,0,3,1> *)__return_storage_ptr__,
               (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

VectorMax3d BVH::point_callback(int f) const
{
    if (getPoint) {
        return getPoint(f);
    }

    if (faces.cols() == 2 || faces.cols() == 3) {
        return vertices.row(faces(f, 0));
    }

    assert(false);
    return VectorMax3d(3);
}